

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_sleep(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  jx9_value *pjVar4;
  
  if ((nArg < 1) || (pjVar4 = *apArg, (pjVar4->iFlags & 2) == 0)) {
LAB_0013a11c:
    pjVar4 = pCtx->pRet;
    jx9MemObjRelease(pjVar4);
    (pjVar4->x).rVal = 0.0;
    uVar3 = pjVar4->iFlags & 0xfffffe90;
  }
  else {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x50) == 0)) {
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                 (pCtx->pFunc->sName).zString);
      goto LAB_0013a11c;
    }
    jx9MemObjToInteger(pjVar4);
    if (*(int *)&pjVar4->x < 0) goto LAB_0013a11c;
    iVar2 = (**(code **)((long)pvVar1 + 0x50))(*(int *)&pjVar4->x * 1000000);
    pjVar4 = pCtx->pRet;
    jx9MemObjRelease(pjVar4);
    uVar3 = pjVar4->iFlags & 0xfffffe90;
    (pjVar4->x).rVal = 0.0;
    if (iVar2 == 0) {
      uVar3 = uVar3 | 2;
      goto LAB_0013a13a;
    }
  }
  uVar3 = uVar3 | 8;
LAB_0013a13a:
  pjVar4->iFlags = uVar3;
  return 0;
}

Assistant:

static int jx9Vfs_sleep(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	int rc, nSleep;
	if( nArg < 1 || !jx9_value_is_int(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xSleep == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Amount to sleep */
	nSleep = jx9_value_to_int(apArg[0]);
	if( nSleep < 0 ){
		/* Invalid value, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation (Microseconds) */
	rc = pVfs->xSleep((unsigned int)(nSleep * SX_USEC_PER_SEC));
	if( rc != JX9_OK ){
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return zero */
		jx9_result_int(pCtx, 0);
	}
	return JX9_OK;
}